

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapepiramHdiv.cpp
# Opt level: O3

void pzshape::TPZShapePiramHdiv::Shape
               (TPZVec<double> *pt,TPZVec<long> *id,TPZVec<int> *order,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  int d;
  long lVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  double dVar15;
  TPZFNMatrix<20,_double> phicp;
  TPZFNMatrix<60,_double> dphicp;
  int local_45c;
  int local_44c;
  double local_420;
  long local_3f0;
  TPZFMatrix<double> local_3e0;
  double local_350 [21];
  TPZFMatrix<double> local_2a8;
  double local_218 [61];
  
  dVar15 = pt->fStore[2];
  local_420 = 0.0;
  if (ABS(dVar15 + -1.0) < 1e-12) {
    pt->fStore[2] = dVar15 + -1e-08;
    local_420 = dVar15;
  }
  local_3e0.fElem = local_350;
  local_3e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_3e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_3e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_3e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_3e0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01816bf8;
  local_3e0.fSize = 0x14;
  local_3e0.fGiven = local_3e0.fElem;
  TPZVec<int>::TPZVec(&local_3e0.fPivot.super_TPZVec<int>,0);
  local_3e0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_3e0.fPivot.super_TPZVec<int>.fStore = local_3e0.fPivot.fExtAlloc;
  local_3e0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_3e0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_3e0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_3e0.fWork.fStore = (double *)0x0;
  local_3e0.fWork.fNElements = 0;
  local_3e0.fWork.fNAlloc = 0;
  local_3e0.fElem = (double *)0x0;
  local_3e0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01816908;
  TPZFMatrix<double>::operator=(&local_3e0,phi);
  local_2a8.fElem = local_218;
  local_2a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_2a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_2a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_2a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_2a8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018175b8;
  local_2a8.fSize = 0x3c;
  local_2a8.fGiven = local_2a8.fElem;
  TPZVec<int>::TPZVec(&local_2a8.fPivot.super_TPZVec<int>,0);
  local_2a8.fPivot.super_TPZVec<int>.fStore = local_2a8.fPivot.fExtAlloc;
  local_2a8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_2a8.fPivot.super_TPZVec<int>.fNElements = 0;
  local_2a8.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_2a8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_2a8.fWork.fStore = (double *)0x0;
  local_2a8.fWork.fNElements = 0;
  local_2a8.fWork.fNAlloc = 0;
  local_2a8.fElem = (double *)0x0;
  local_2a8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018172c8;
  TPZFMatrix<double>::operator=(&local_2a8,dphi);
  TPZShapePiram::Shape(pt,id,order,&local_3e0,&local_2a8);
  dVar15 = 1.0 / (1.0 - pt->fStore[2]);
  uVar5 = 0;
  local_45c = 0;
  iVar3 = 0;
  do {
    if (uVar5 == 4) {
      local_45c = local_45c + 1;
    }
    else {
      if (uVar5 < 5) {
        uVar12 = 1;
        local_44c = 2;
LAB_00fdf28f:
        lVar4 = (long)local_45c;
        local_3f0 = lVar4 * 8;
        lVar14 = (long)iVar3 * 8;
        uVar9 = 0;
        lVar13 = local_3f0;
        do {
          lVar8 = uVar9 + lVar4;
          if (((lVar8 < 0) || (local_3e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar8))
             || (local_3e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar7 = uVar9 + (long)iVar3;
          if (((lVar7 < 0) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar7)) ||
             ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          phi->fElem[lVar7] = local_3e0.fElem[lVar8];
          lVar10 = 0;
          do {
            if (((local_2a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar10) ||
                (lVar8 < 0)) ||
               (local_2a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar8)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar1 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
            if (((lVar1 <= lVar10) || (lVar7 < 0)) ||
               ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar7)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            *(undefined8 *)((long)dphi->fElem + lVar10 * 8 + lVar1 * lVar14) =
                 *(undefined8 *)
                  ((long)local_2a8.fElem +
                  lVar10 * 8 + local_2a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar13);
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
          uVar9 = uVar9 + 1;
          lVar13 = lVar13 + 8;
          lVar14 = lVar14 + 8;
        } while (uVar9 != uVar12);
        uVar2 = (uint)uVar12;
        if (uVar2 * 2 == local_44c) {
          uVar9 = 0;
          iVar6 = iVar3 + uVar2;
          do {
            lVar14 = uVar9 + lVar4;
            if (((lVar14 < 0) ||
                (local_3e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar14)) ||
               (local_3e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            iVar11 = iVar3 + uVar2 + (int)uVar9;
            lVar13 = (long)iVar11;
            if (((iVar11 < 0) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar13)
                ) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            phi->fElem[lVar13] = local_3e0.fElem[lVar14] * dVar15;
            lVar8 = 0;
            do {
              if (((local_2a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar8) ||
                  (lVar14 < 0)) ||
                 (local_2a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar14)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              lVar7 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
              if (((lVar7 <= lVar8) || (iVar11 < 0)) ||
                 ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar13)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              *(double *)((long)dphi->fElem + lVar8 * 8 + (long)iVar6 * 8 * lVar7) =
                   *(double *)
                    ((long)local_2a8.fElem +
                    lVar8 * 8 +
                    local_2a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * local_3f0) * dVar15
              ;
              lVar8 = lVar8 + 1;
            } while (lVar8 != 3);
            if (((lVar14 < 0) ||
                (local_3e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar14)) ||
               (local_3e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if (((lVar7 < 3) || (iVar11 < 0)) ||
               ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar13)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            dphi->fElem[lVar7 * lVar13 + 2] =
                 local_3e0.fElem[lVar14] * dVar15 * dVar15 + dphi->fElem[lVar7 * lVar13 + 2];
            uVar9 = uVar9 + 1;
            local_3f0 = local_3f0 + 8;
            iVar6 = iVar6 + 1;
          } while (uVar9 != uVar12);
        }
      }
      else {
        uVar2 = TPZShapePiram::NConnectShapeF((int)uVar5,order->fStore[uVar5 - 5]);
        uVar12 = (ulong)uVar2;
        local_44c = NConnectShapeF((int)uVar5,order->fStore[uVar5 - 5]);
        if (0 < (int)uVar2) goto LAB_00fdf28f;
      }
      local_45c = uVar2 + local_45c;
      iVar3 = iVar3 + local_44c;
    }
    uVar5 = uVar5 + 1;
    if (uVar5 == 0x13) {
      if (ABS(local_420 + -1.0) < 1e-12) {
        pt->fStore[2] = local_420;
      }
      TPZFMatrix<double>::~TPZFMatrix(&local_2a8,&PTR_PTR_01817580);
      TPZFMatrix<double>::~TPZFMatrix(&local_3e0,&PTR_PTR_01816bc0);
      return;
    }
  } while( true );
}

Assistant:

void TPZShapePiramHdiv::Shape(TPZVec<REAL> &pt, TPZVec<int64_t> &id, TPZVec<int> &order, TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
        
        REAL temp = 0.;
        if (IsZero(pt[2] - 1.)){
            temp = pt[2];
            pt[2] -= 1.e-8;
        }
        
        TPZFNMatrix<20,REAL> phicp(phi);
        TPZFNMatrix<60,REAL> dphicp(dphi);
        
        TPZShapePiram::Shape(pt, id, order, phicp, dphicp);
        
        REAL zst = 1./(1.-pt[2]);
        int count = 0;
        int countorig = 0;
        for (int is=0; is<NSides; is++) {
            if (is == 4) {
                countorig++;
                continue;
            }
            int norig = 1;
            int nshape = 2;
            if (is>4)
            {
                norig = TPZShapePiram::NConnectShapeF(is, order[is-5]);
                nshape = NConnectShapeF(is, order[is-5]);
            }
            for (int shape = 0; shape<norig; shape++)
            {
                phi(shape+count,0) = phicp(shape+countorig,0);
                for (int d=0; d<3; d++) {
                    dphi(d,shape+count) = dphicp(d,shape+countorig);
                }
            }
            if(norig*2 == nshape)
            {
                for (int shape = 0; shape<norig; shape++)
                {
                    phi(shape+norig+count,0) = phicp(shape+countorig,0)*zst;
                    for (int d=0; d<3; d++) {
                        dphi(d,shape+norig+count) = dphicp(d,shape+countorig)*zst;
                    }
                    dphi(2,shape+norig+count) += phicp(shape+countorig,0)*zst*zst;
                }
            }
            countorig+= norig;
            count += nshape;
        }
        if (IsZero(temp - 1.))
        {
            pt[2] = temp;
        }
    }